

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O1

void sptk::world::histc(double *x,int x_length,double *edges,int edges_length,int *index)

{
  double dVar1;
  double dVar2;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  double dVar3;
  
  iVar8 = 0;
  uVar9 = 0;
  if (0 < edges_length) {
    dVar1 = *x;
    uVar11 = 0;
    do {
      index[uVar11] = 1;
      uVar9 = uVar11;
      if (dVar1 <= edges[uVar11]) break;
      uVar11 = uVar11 + 1;
      uVar9 = (ulong)(uint)edges_length;
    } while ((uint)edges_length != uVar11);
  }
  uVar10 = (uint)uVar9;
  if ((int)uVar10 < edges_length) {
    uVar7 = 1;
    do {
      iVar8 = (int)uVar9;
      dVar1 = x[uVar7];
      dVar2 = edges[iVar8];
      dVar3 = edges[iVar8];
      index[iVar8] = uVar7;
      uVar10 = (uint)(dVar1 < dVar3 || dVar1 == dVar2);
      uVar7 = uVar7 + uVar10;
      uVar10 = iVar8 - uVar10;
      if (uVar7 == x_length) break;
      uVar10 = uVar10 + 1;
      uVar9 = (ulong)uVar10;
    } while ((int)uVar10 < edges_length);
    iVar8 = uVar7 - 1;
  }
  auVar6 = _DAT_0012bf60;
  auVar5 = _DAT_0012bcc0;
  auVar4 = _DAT_0012bcb0;
  if ((int)(uVar10 + 1) < edges_length) {
    uVar7 = (edges_length - uVar10) - 2;
    auVar12._4_4_ = 0;
    auVar12._0_4_ = uVar7;
    auVar12._8_4_ = uVar7;
    auVar12._12_4_ = 0;
    uVar9 = 0;
    auVar12 = auVar12 ^ _DAT_0012bcc0;
    do {
      auVar14._8_4_ = (int)uVar9;
      auVar14._0_8_ = uVar9;
      auVar14._12_4_ = (int)(uVar9 >> 0x20);
      auVar15 = (auVar14 | auVar4) ^ auVar5;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        index[(long)(int)uVar10 + uVar9 + 1] = iVar8;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        index[(long)(int)uVar10 + uVar9 + 2] = iVar8;
      }
      auVar14 = (auVar14 | auVar6) ^ auVar5;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
        index[(long)(int)uVar10 + uVar9 + 3] = iVar8;
        index[(long)(int)uVar10 + uVar9 + 4] = iVar8;
      }
      uVar9 = uVar9 + 4;
    } while (((ulong)uVar7 + 4 & 0xfffffffffffffffc) != uVar9);
  }
  return;
}

Assistant:

void histc(const double *x, int x_length, const double *edges,
    int edges_length, int *index) {
  int count = 1;

  int i = 0;
  for (; i < edges_length; ++i) {
    index[i] = 1;
    if (edges[i] >= x[0]) break;
  }
  for (; i < edges_length; ++i) {
    if (edges[i] < x[count]) {
      index[i] = count;
    } else {
      index[i--] = count++;
    }
    if (count == x_length) break;
  }
  count--;
  for (i++; i < edges_length; ++i) index[i] = count;
}